

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.h
# Opt level: O0

char * __thiscall QByteArray::data(QByteArray *this)

{
  char *pcVar1;
  QArrayDataPointer<char> *in_RDI;
  
  detach((QByteArray *)in_RDI);
  pcVar1 = QArrayDataPointer<char>::data(in_RDI);
  return pcVar1;
}

Assistant:

inline char *QByteArray::data()
{
    detach();
    Q_ASSERT(d.data());
    return d.data();
}